

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  Expression_lhs EVar2;
  char *pcVar3;
  uint uVar4;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  EVar1 = *this;
  EVar2 = this[5];
  if (((((byte)EVar2 ^ (byte)EVar1) & 1) == 0) || (*(char *)(g_cs + 0x74) == '\x01')) {
    pcVar3 = "false";
    if (EVar1 != (Expression_lhs)0x0) {
      pcVar3 = "true";
    }
    String::String((String *)&local_38.data,pcVar3,(byte)EVar1 ^ 5);
    __return_storage_ptr__->m_passed = (bool)(((byte)EVar2 ^ (byte)EVar1) & 1);
    if (local_38.buf[0x17] < '\0') {
      (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = -0x80;
      (__return_storage_ptr__->m_decomp).field_0.data.size = local_38.data.size;
      uVar4 = local_38.data.size + 1;
      (__return_storage_ptr__->m_decomp).field_0.data.capacity = uVar4;
      pcVar3 = (char *)operator_new__((ulong)uVar4);
      (__return_storage_ptr__->m_decomp).field_0.data.ptr = pcVar3;
      memcpy(pcVar3,local_38.data.ptr,(ulong)uVar4);
      if (local_38.data.ptr != (char *)0x0) {
        operator_delete__(local_38.data.ptr);
      }
    }
    else {
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 0x10) =
           CONCAT17(local_38.buf[0x17],local_38._16_7_);
      (__return_storage_ptr__->m_decomp).field_0.data.ptr = local_38.data.ptr;
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 8) =
           CONCAT44(local_38.data.capacity,local_38.data.size);
    }
  }
  else {
    __return_storage_ptr__->m_passed = true;
    (__return_storage_ptr__->m_decomp).field_0.data.ptr = (char *)0x0;
    (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = '\x17';
  }
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }